

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qhttpmultipart.cpp
# Opt level: O2

QDebug operator<<(QDebug debug,QHttpPart *part)

{
  QHttpPartPrivate *pQVar1;
  bool t;
  long *plVar2;
  QDebug *pQVar3;
  long *in_RDX;
  long in_FS_OFFSET;
  QDebugStateSaver saver;
  Stream *local_68;
  QHash<QNetworkRequest::KnownHeaders,_QVariant> local_60;
  undefined1 local_58 [8];
  QHttpHeaders local_50;
  undefined1 local_48 [8];
  undefined1 *local_40;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  local_40 = &DAT_aaaaaaaaaaaaaaaa;
  QDebugStateSaver::QDebugStateSaver((QDebugStateSaver *)&local_40,(QDebug *)part);
  plVar2 = (long *)QDebug::resetFormat();
  *(undefined2 *)(*plVar2 + 0x30) = 0x100;
  pQVar3 = QDebug::operator<<((QDebug *)part,"QHttpPart(headers = [");
  local_60.d = (Data *)pQVar3->stream;
  local_60.d[1].ref.atomic._q_value.super___atomic_base<int>._M_i =
       local_60.d[1].ref.atomic._q_value.super___atomic_base<int>._M_i + 1;
  operator<<((Stream *)local_58,&local_60);
  pQVar3 = QDebug::operator<<((QDebug *)local_58,"], http headers = [");
  local_50.d.d.ptr = (QExplicitlySharedDataPointer<QHttpHeadersPrivate>)pQVar3->stream;
  *(int *)((long)local_50.d.d.ptr + 0x28) = *(int *)((long)local_50.d.d.ptr + 0x28) + 1;
  operator<<((Stream *)local_48,&local_50);
  QDebug::operator<<((QDebug *)local_48,"],");
  QDebug::~QDebug((QDebug *)local_48);
  QDebug::~QDebug((QDebug *)&local_50);
  QDebug::~QDebug((QDebug *)local_58);
  QDebug::~QDebug((QDebug *)&local_60);
  if (*(long *)(*in_RDX + 0x68) == 0) {
    pQVar3 = QDebug::operator<<((QDebug *)part," size of body = ");
    pQVar3 = QDebug::operator<<(pQVar3,*(qint64 *)(*in_RDX + 0x60));
    QDebug::operator<<(pQVar3," bytes");
  }
  else {
    pQVar3 = QDebug::operator<<((QDebug *)part," bodydevice = [");
    local_68 = pQVar3->stream;
    *(int *)(local_68 + 0x28) = *(int *)(local_68 + 0x28) + 1;
    operator<<((Stream *)local_48,(QObject *)&local_68);
    pQVar3 = QDebug::operator<<((QDebug *)local_48,", is open: ");
    t = (bool)QIODevice::isOpen();
    pQVar3 = QDebug::operator<<(pQVar3,t);
    QDebug::operator<<(pQVar3,"]");
    QDebug::~QDebug((QDebug *)local_48);
    QDebug::~QDebug((QDebug *)&local_68);
  }
  QDebug::operator<<((QDebug *)part,")");
  pQVar1 = (part->d).d.ptr;
  (part->d).d.ptr = (QHttpPartPrivate *)0x0;
  *(QHttpPartPrivate **)debug.stream = pQVar1;
  QDebugStateSaver::~QDebugStateSaver((QDebugStateSaver *)&local_40);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return (QDebug)debug.stream;
  }
  __stack_chk_fail();
}

Assistant:

QDebug operator<<(QDebug debug, const QHttpPart &part)
{
    const QDebugStateSaver saver(debug);
    debug.resetFormat().nospace().noquote();

    debug << "QHttpPart(headers = ["
          << part.d->cookedHeaders
          << "], http headers = ["
          << part.d->httpHeaders
          << "],";

    if (part.d->bodyDevice) {
        debug << " bodydevice = ["
              << part.d->bodyDevice
              << ", is open: "
              << part.d->bodyDevice->isOpen()
              << "]";
    } else {
        debug << " size of body = "
              << part.d->body.size()
              << " bytes";
    }

    debug << ")";

    return debug;
}